

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::FCDUIterCollationIterator::handleNextCE32
          (FCDUIterCollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  char16_t cVar3;
  UChar32 UVar4;
  int32_t iVar5;
  UErrorCode *errorCode_local;
  UChar32 *c_local;
  FCDUIterCollationIterator *this_local;
  
LAB_0027d8ec:
  while (this->state == ITER_CHECK_FWD) {
    UVar4 = (*(code *)((this->super_UIterCollationIterator).iter)->next)
                      ((this->super_UIterCollationIterator).iter);
    *c = UVar4;
    if (*c < 0) {
      return 0xc0;
    }
    UVar2 = CollationFCD::hasTccc(*c);
    if (UVar2 == '\0') goto LAB_0027da82;
    UVar2 = CollationFCD::maybeTibetanCompositeVowel(*c);
    if (UVar2 == '\0') {
      UVar4 = (*(code *)((this->super_UIterCollationIterator).iter)->current)
                        ((this->super_UIterCollationIterator).iter);
      UVar2 = CollationFCD::hasLccc(UVar4);
      if (UVar2 == '\0') goto LAB_0027da82;
    }
    (*(code *)((this->super_UIterCollationIterator).iter)->previous)
              ((this->super_UIterCollationIterator).iter);
    UVar2 = nextSegment(this,errorCode);
    if (UVar2 == '\0') {
      *c = -1;
      return 0xc0;
    }
  }
  if ((this->state == ITER_IN_FCD_SEGMENT) && (this->pos != this->limit)) {
    UVar4 = (*(code *)((this->super_UIterCollationIterator).iter)->next)
                      ((this->super_UIterCollationIterator).iter);
    *c = UVar4;
    this->pos = this->pos + 1;
  }
  else {
    if (((int)this->state < 3) ||
       (iVar1 = this->pos, iVar5 = UnicodeString::length(&this->normalized), iVar1 == iVar5)) {
      switchToForward(this);
      goto LAB_0027d8ec;
    }
    iVar1 = this->pos;
    this->pos = iVar1 + 1;
    cVar3 = UnicodeString::operator[](&this->normalized,iVar1);
    *c = (uint)(ushort)cVar3;
  }
LAB_0027da82:
  return ((this->super_UIterCollationIterator).super_CollationIterator.trie)->data32
         [(int)((uint)((this->super_UIterCollationIterator).super_CollationIterator.trie)->index
                      [*c >> 5] * 4 + (*c & 0x1fU))];
}

Assistant:

uint32_t
FCDUIterCollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(state == ITER_CHECK_FWD) {
            c = iter.next(&iter);
            if(c < 0) {
                return Collation::FALLBACK_CE32;
            }
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        CollationFCD::hasLccc(iter.current(&iter))) {
                    iter.previous(&iter);
                    if(!nextSegment(errorCode)) {
                        c = U_SENTINEL;
                        return Collation::FALLBACK_CE32;
                    }
                    continue;
                }
            }
            break;
        } else if(state == ITER_IN_FCD_SEGMENT && pos != limit) {
            c = iter.next(&iter);
            ++pos;
            U_ASSERT(c >= 0);
            break;
        } else if(state >= IN_NORM_ITER_AT_LIMIT && pos != normalized.length()) {
            c = normalized[pos++];
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}